

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O2

lua_State * lua_newstate(lua_Alloc f,void *ud)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  time_t tVar4;
  size_t t;
  lua_State *L;
  long lVar5;
  uint local_3c;
  char buff [24];
  
  L = (lua_State *)0x0;
  pvVar3 = (*f)(ud,(void *)0x0,8,0x658);
  if (pvVar3 != (void *)0x0) {
    L = (lua_State *)((long)pvVar3 + 8);
    *(undefined2 *)((long)pvVar3 + 0x10) = 0x808;
    *(undefined1 *)((long)pvVar3 + 0x134) = 8;
    preinit_thread(L,(global_State *)((long)pvVar3 + 0xd0));
    *(lua_State **)((long)pvVar3 + 0x140) = L;
    *(undefined8 *)((long)pvVar3 + 8) = 0;
    *(int *)((long)pvVar3 + 0xb8) = *(int *)((long)pvVar3 + 0xb8) + 0x10000;
    *(lua_Alloc *)((long)pvVar3 + 0xd0) = f;
    *(void **)((long)pvVar3 + 0xd8) = ud;
    *(undefined8 *)((long)pvVar3 + 0x648) = 0;
    *(undefined8 *)((long)pvVar3 + 0x650) = 0;
    *(lua_State **)((long)pvVar3 + 0x1d8) = L;
    tVar4 = time((time_t *)0x0);
    buff._8_8_ = &local_3c;
    local_3c = (uint)tVar4;
    buff._16_8_ = lua_newstate;
    buff._0_8_ = L;
    uVar1 = luaS_hash(buff,0x18,local_3c);
    *(uint *)((long)pvVar3 + 0x130) = uVar1;
    *(undefined1 *)((long)pvVar3 + 0x118) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1d0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x100) = 0;
    *(undefined8 *)((long)pvVar3 + 0x108) = 0;
    memset((void *)((long)pvVar3 + 0x148),0,0x88);
    *(undefined8 *)((long)pvVar3 + 0xe0) = 0x658;
    *(undefined8 *)((long)pvVar3 + 0xe8) = 0;
    *(undefined8 *)((long)pvVar3 + 0xf8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x120) = 0;
    *(undefined1 *)((long)pvVar3 + 0x128) = 3;
    *(undefined2 *)((long)pvVar3 + 0x13d) = 0xd19;
    *(undefined8 *)((long)pvVar3 + 0x135) = 0x3200021914000008;
    for (lVar5 = 0; lVar5 != 9; lVar5 = lVar5 + 1) {
      *(undefined8 *)((long)pvVar3 + lVar5 * 8 + 0x2b0) = 0;
    }
    iVar2 = luaD_rawrunprotected(L,f_luaopen,(void *)0x0);
    if (iVar2 != 0) {
      close_state(L);
      L = (lua_State *)0x0;
    }
  }
  return L;
}

Assistant:

LUA_API lua_State *lua_newstate (lua_Alloc f, void *ud) {
  int i;
  lua_State *L;
  global_State *g;
  LG *l = cast(LG *, (*f)(ud, NULL, LUA_TTHREAD, sizeof(LG)));
  if (l == NULL) return NULL;
  L = &l->l.l;
  g = &l->g;
  L->tt = LUA_VTHREAD;
  g->currentwhite = bitmask(WHITE0BIT);
  L->marked = luaC_white(g);
  preinit_thread(L, g);
  g->allgc = obj2gco(L);  /* by now, only object is the main thread */
  L->next = NULL;
  incnny(L);  /* main thread is always non yieldable */
  g->frealloc = f;
  g->ud = ud;
  g->warnf = NULL;
  g->ud_warn = NULL;
  g->mainthread = L;
  g->seed = luai_makeseed(L);
  g->gcstp = GCSTPGC;  /* no GC while building state */
  g->strt.size = g->strt.nuse = 0;
  g->strt.hash = NULL;
  setnilvalue(&g->l_registry);
  g->panic = NULL;
  g->gcstate = GCSpause;
  g->gckind = KGC_INC;
  g->gcstopem = 0;
  g->gcemergency = 0;
  g->finobj = g->tobefnz = g->fixedgc = NULL;
  g->firstold1 = g->survival = g->old1 = g->reallyold = NULL;
  g->finobjsur = g->finobjold1 = g->finobjrold = NULL;
  g->sweepgc = NULL;
  g->gray = g->grayagain = NULL;
  g->weak = g->ephemeron = g->allweak = NULL;
  g->twups = NULL;
  g->totalbytes = sizeof(LG);
  g->GCdebt = 0;
  g->lastatomic = 0;
  setivalue(&g->nilvalue, 0);  /* to signal that state is not yet built */
  setgcparam(g->gcpause, LUAI_GCPAUSE);
  setgcparam(g->gcstepmul, LUAI_GCMUL);
  g->gcstepsize = LUAI_GCSTEPSIZE;
  setgcparam(g->genmajormul, LUAI_GENMAJORMUL);
  g->genminormul = LUAI_GENMINORMUL;
  for (i=0; i < LUA_NUMTAGS; i++) g->mt[i] = NULL;
  if (luaD_rawrunprotected(L, f_luaopen, NULL) != LUA_OK) {
    /* memory allocation error: free partial state */
    close_state(L);
    L = NULL;
  }
  return L;
}